

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parseBlockItems
          (Parser *this,TokenKind endKind,Token *end,bool inConstructor)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  SourceLocation location;
  SourceLocation SVar5;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  byte bVar6;
  byte bVar7;
  undefined6 in_register_00000032;
  BumpAllocator *dst;
  bool bVar8;
  TokenKind kind;
  Token TVar9;
  AttrList AVar10;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> sVar11;
  SyntaxNode *newNode;
  undefined4 local_e8;
  undefined4 local_e4;
  Token local_e0;
  Token *local_d0;
  SmallVector<slang::syntax::SyntaxNode_*,_16UL> buffer;
  
  local_e4 = (undefined4)CONCAT71(in_register_00000009,inConstructor);
  local_e8 = (undefined4)CONCAT62(in_register_00000032,endKind);
  buffer.super_SmallVectorBase<slang::syntax::SyntaxNode_*>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::SyntaxNode_*>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::SyntaxNode_*>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::SyntaxNode_*>.cap = 0x10;
  local_d0 = end;
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  uVar4 = TVar9._0_8_;
  bVar8 = false;
  bVar2 = false;
  bVar6 = 0;
  do {
    kind = (TokenKind)uVar4;
    bVar3 = slang::syntax::SyntaxFacts::isEndKeyword(kind);
    if (((bVar3) || (kind == (TokenKind)local_e8)) || (kind == EndOfFile)) {
      if ((TokenKind)local_e8 == JoinKeyword) {
        if ((ushort)(kind - JoinKeyword) < 3) {
          TVar9 = ParserBase::consume(&this->super_ParserBase);
        }
        else {
          TVar9 = ParserBase::expect(&this->super_ParserBase,JoinKeyword);
        }
      }
      else {
        TVar9 = ParserBase::expect(&this->super_ParserBase,(TokenKind)local_e8);
      }
      *local_d0 = TVar9;
      dst = (this->super_ParserBase).alloc;
      sVar11._M_ptr._0_4_ =
           SmallVectorBase<slang::syntax::SyntaxNode_*>::copy
                     (&buffer.super_SmallVectorBase<slang::syntax::SyntaxNode_*>,(EVP_PKEY_CTX *)dst
                      ,(EVP_PKEY_CTX *)TVar9.info);
      sVar11._M_ptr._4_4_ = extraout_var;
      SmallVectorBase<slang::syntax::SyntaxNode_*>::cleanup
                (&buffer.super_SmallVectorBase<slang::syntax::SyntaxNode_*>,(EVP_PKEY_CTX *)dst);
      sVar11._M_extent._M_extent_value = extraout_RDX._M_extent_value;
      return sVar11;
    }
    local_e0 = ParserBase::peek(&this->super_ParserBase);
    location = Token::location(&local_e0);
    newNode = (SyntaxNode *)0x0;
    bVar3 = isPortDeclaration(this,true);
    if (bVar3) {
      AVar10 = parseAttributes(this);
      newNode = (SyntaxNode *)parsePortDeclaration(this,AVar10);
LAB_0057f173:
      bVar3 = false;
LAB_0057f17b:
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      newNode->previewNode = pSVar1;
      SmallVectorBase<slang::syntax::SyntaxNode*>::emplace_back<slang::syntax::SyntaxNode*const&>
                ((SmallVectorBase<slang::syntax::SyntaxNode*> *)&buffer,&newNode);
      if ((bVar3 == false && !bVar8) && (bVar8 = false, bVar2)) {
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x190005,location);
        bVar8 = true;
      }
      bVar6 = 0;
    }
    else {
      bVar3 = isVariableDeclaration(this);
      if (bVar3) {
        AVar10 = parseAttributes(this);
        newNode = &parseVariableDeclaration(this,AVar10)->super_SyntaxNode;
        goto LAB_0057f173;
      }
      bVar3 = slang::syntax::SyntaxFacts::isPossibleStatement(kind);
      if (bVar3) {
        newNode = &parseStatement(this,true,(bool)((bVar2 ^ 1U) & (byte)local_e4))->super_SyntaxNode
        ;
        if (((((StatementSyntax *)newNode)->super_SyntaxNode).kind == EmptyStatement) &&
           (((((StatementSyntax *)((long)newNode + 0x58))->super_SyntaxNode).kind & 0x10000) !=
            Unknown)) {
          local_e0 = ParserBase::peek(&this->super_ParserBase);
          SVar5 = Token::location(&local_e0);
          bVar2 = true;
          if (location == SVar5) {
            ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
          }
        }
        else {
          bVar2 = true;
        }
      }
      else {
        bVar7 = ~bVar6;
        bVar6 = 1;
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)(bVar7 & 1) << 0x20 | 0x510005));
      }
      if (newNode != (SyntaxNode *)0x0) goto LAB_0057f17b;
    }
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    uVar4 = TVar9._0_8_;
  } while( true );
}

Assistant:

std::span<SyntaxNode*> Parser::parseBlockItems(TokenKind endKind, Token& end, bool inConstructor) {
    SmallVector<SyntaxNode*, 16> buffer;
    auto kind = peek().kind;
    bool errored = false;
    bool sawStatement = false;
    bool erroredAboutDecls = false;

    while (!isEndKeyword(kind) && kind != endKind && kind != TokenKind::EndOfFile) {
        SourceLocation loc = peek().location();
        SyntaxNode* newNode = nullptr;
        bool isStmt = false;

        if (isPortDeclaration(/* inStatement */ true)) {
            newNode = &parsePortDeclaration(parseAttributes());
        }
        else if (isVariableDeclaration()) {
            newNode = &parseVariableDeclaration(parseAttributes());
        }
        else if (isPossibleStatement(kind)) {
            newNode = &parseStatement(/* allowEmpty */ true,
                                      /* allowSuperNew */ inConstructor && !sawStatement);
            if (newNode->kind == SyntaxKind::EmptyStatement &&
                newNode->as<EmptyStatementSyntax>().semicolon.isMissing() &&
                loc == peek().location()) {
                skipToken(std::nullopt);
            }
            isStmt = true;
            sawStatement = true;
        }
        else {
            skipToken(errored ? std::nullopt : std::make_optional(diag::ExpectedStatement));
            errored = true;
        }

        if (newNode) {
            newNode->previewNode = std::exchange(previewNode, nullptr);
            buffer.push_back(newNode);
            errored = false;

            if (!erroredAboutDecls && !isStmt && sawStatement) {
                addDiag(diag::DeclarationsAtStart, loc);
                erroredAboutDecls = true;
            }
        }
        kind = peek().kind;
    }

    // parallel blocks can end in one of three join keywords
    if (endKind == TokenKind::JoinKeyword) {
        switch (kind) {
            case TokenKind::JoinKeyword:
            case TokenKind::JoinAnyKeyword:
            case TokenKind::JoinNoneKeyword:
                end = consume();
                break;
            default:
                end = expect(endKind);
                break;
        }
    }
    else {
        end = expect(endKind);
    }

    return buffer.copy(alloc);
}